

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

upb_MiniTableField * upb_MiniTable_FindFieldByNumber(upb_MiniTable *m,uint32_t number)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t lo_mid;
  int32_t hi_mid;
  uint32_t num;
  uint32_t mid;
  upb_MiniTableField *base;
  int32_t hi;
  uint32_t lo;
  size_t i;
  uint32_t number_local;
  upb_MiniTable *m_local;
  
  uVar4 = (ulong)number - 1;
  if (uVar4 < m->dense_below_dont_copy_me__upb_internal_use_only) {
    if (m->fields_dont_copy_me__upb_internal_use_only[uVar4].
        number_dont_copy_me__upb_internal_use_only != number) {
      __assert_fail("m->fields_dont_copy_me__upb_internal_use_only[i].number_dont_copy_me__upb_internal_use_only == number"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/message.c"
                    ,0x18,
                    "const upb_MiniTableField *upb_MiniTable_FindFieldByNumber(const upb_MiniTable *, uint32_t)"
                   );
    }
    m_local = (upb_MiniTable *)(m->fields_dont_copy_me__upb_internal_use_only + uVar4);
  }
  else {
    iVar2 = m->field_count_dont_copy_me__upb_internal_use_only - 1;
    base._4_4_ = (uint)m->dense_below_dont_copy_me__upb_internal_use_only;
    while (base._0_4_ = iVar2, (int)base._4_4_ <= (int)base) {
      uVar3 = (int)base + base._4_4_ >> 1;
      uVar1 = m->fields_dont_copy_me__upb_internal_use_only[uVar3].
              number_dont_copy_me__upb_internal_use_only;
      if (uVar1 == number) {
        return m->fields_dont_copy_me__upb_internal_use_only + uVar3;
      }
      iVar2 = uVar3 - 1;
      if (uVar1 < number) {
        iVar2 = (int)base;
        base._4_4_ = uVar3 + 1;
      }
    }
    m_local = (upb_MiniTable *)0x0;
  }
  return (upb_MiniTableField *)m_local;
}

Assistant:

const upb_MiniTableField* upb_MiniTable_FindFieldByNumber(
    const upb_MiniTable* m, uint32_t number) {
  const size_t i = ((size_t)number) - 1;  // 0 wraps to SIZE_MAX

  // Ideal case: index into dense fields
  if (i < m->UPB_PRIVATE(dense_below)) {
    UPB_ASSERT(m->UPB_PRIVATE(fields)[i].UPB_PRIVATE(number) == number);
    return &m->UPB_PRIVATE(fields)[i];
  }

  // Slow case: binary search
  uint32_t lo = m->UPB_PRIVATE(dense_below);
  int32_t hi = m->UPB_PRIVATE(field_count) - 1;
  const upb_MiniTableField* base = m->UPB_PRIVATE(fields);
  while (hi >= (int32_t)lo) {
    uint32_t mid = (hi + lo) / 2;
    uint32_t num = base[mid].UPB_ONLYBITS(number);
    // These comparison operations allow, on ARM machines, to fuse all these
    // branches into one comparison followed by two CSELs to set the lo/hi
    // values, followed by a BNE to continue or terminate the loop. Since binary
    // search branches are generally unpredictable (50/50 in each direction),
    // this is a good deal. We use signed for the high, as this decrement may
    // underflow if mid is 0.
    int32_t hi_mid = mid - 1;
    uint32_t lo_mid = mid + 1;
    if (num == number) {
      return &base[mid];
    }
    if (UPB_UNPREDICTABLE(num < number)) {
      lo = lo_mid;
    } else {
      hi = hi_mid;
    }
  }

  return NULL;
}